

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::FatalConditionHandler::FatalConditionHandler(FatalConditionHandler *this)

{
  size_t i;
  sigaction sa;
  stack_t sigStack;
  ulong local_c0;
  sigaction local_b8;
  sigaltstack local_20;
  
  (anonymous_namespace)::FatalConditionHandler::isSet = 1;
  local_20.ss_sp = (anonymous_namespace)::FatalConditionHandler::altStackMem;
  local_20.ss_size = (anonymous_namespace)::FatalConditionHandler::altStackSize;
  local_20.ss_flags = 0;
  sigaltstack(&local_20,(sigaltstack *)(anonymous_namespace)::FatalConditionHandler::oldSigStack);
  memset(&local_b8,0,0x98);
  local_b8.__sigaction_handler.sa_handler = handleSignal;
  local_b8.sa_flags = 0x8000000;
  for (local_c0 = 0; local_c0 < 6; local_c0 = local_c0 + 1) {
    sigaction(*(int *)((anonymous_namespace)::signalDefs + local_c0 * 0x10),&local_b8,
              (sigaction *)
              ((anonymous_namespace)::FatalConditionHandler::oldSigActions + local_c0 * 0x98));
  }
  return;
}

Assistant:

FatalConditionHandler() {
            isSet = true;
            stack_t sigStack;
            sigStack.ss_sp    = altStackMem;
            sigStack.ss_size  = altStackSize;
            sigStack.ss_flags = 0;
            sigaltstack(&sigStack, &oldSigStack);
            struct sigaction sa = {};
            sa.sa_handler       = handleSignal; // NOLINT
            sa.sa_flags         = SA_ONSTACK;
            for(std::size_t i = 0; i < DOCTEST_COUNTOF(signalDefs); ++i) {
                sigaction(signalDefs[i].id, &sa, &oldSigActions[i]);
            }
        }